

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

QApplicationPrivate * __thiscall
QApplicationPrivate::applyQIconStyleHelper(QApplicationPrivate *this,Mode mode,QPixmap *base)

{
  QPalettePrivate *pQVar1;
  ColorGroup CVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  QStyleOption opt;
  QPalette local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption((QStyleOption *)&local_78,0,0);
  QGuiApplication::palette();
  pQVar1 = pQStack_50;
  CVar2 = (ColorGroup)local_48;
  local_48 = (undefined1 *)CONCAT44(local_48._4_4_,local_88.currentGroup);
  local_88.currentGroup = CVar2;
  pQStack_50 = local_88.d;
  local_88.d = pQVar1;
  QPalette::~QPalette(&local_88);
  pQVar3 = QApplication::style();
  (**(code **)(*(long *)pQVar3 + 0x108))(this,pQVar3,(ulong)base & 0xffffffff);
  QStyleOption::~QStyleOption((QStyleOption *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QApplicationPrivate::applyQIconStyleHelper(QIcon::Mode mode, const QPixmap& base) const
{
    QStyleOption opt(0);
    opt.palette = QGuiApplication::palette();
    return QApplication::style()->generatedIconPixmap(mode, base, &opt);
}